

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numrange.cc
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *range;
  ostream *poVar2;
  pointer piVar3;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  range = argv[1];
  if (range == (char *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"null");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    QUtil::parse_numrange((vector<int,_std::allocator<int>_> *)&local_40,range,0xf);
    poVar2 = std::operator<<((ostream *)&std::cout,"numeric range ");
    poVar2 = std::operator<<(poVar2,range);
    std::operator<<(poVar2," ->");
    for (piVar3 = local_40._M_impl.super__Vector_impl_data._M_start;
        piVar3 != local_40._M_impl.super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
      iVar1 = *piVar3;
      poVar2 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::operator<<((ostream *)poVar2,iVar1);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  }
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    try {
        test_numrange(argv[1]);
    } catch (std::exception& e) {
        std::cout << e.what() << std::endl;
        return 2;
    }

    return 0;
}